

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expertInline.hpp
# Opt level: O0

Scal __thiscall LinearExpert::queryHafterZX(LinearExpert *this)

{
  double dVar1;
  MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this_00;
  long in_RDI;
  ReturnType RVar2;
  double dVar3;
  double dVar4;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_stack_ffffffffffffffb8;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_stack_ffffffffffffffd8;
  
  this_00 = (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(in_RDI + 0x210);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
            (this_00,in_stack_ffffffffffffffb8);
  RVar2 = Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
          dot<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
                    ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this_00,
                     (MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                      *)in_stack_ffffffffffffffb8);
  dVar3 = exp(RVar2 * -0.5);
  dVar1 = *(double *)(in_RDI + 0x238);
  Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::cwiseAbs2(in_stack_ffffffffffffffd8);
  RVar2 = Eigen::
          MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>
          ::dot<Eigen::Matrix<double,_1,1,0,_1,1>>
                    ((MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      *)this_00,in_stack_ffffffffffffffb8);
  dVar4 = exp(RVar2 * -0.5);
  *(double *)(in_RDI + 0x130) = dVar3 * dVar1 * dVar4 * *(double *)(in_RDI + 0x240);
  return *(Scal *)(in_RDI + 0x130);
}

Assistant:

EXPERT_CLASS_TEMPLATE
Scal LINEAR_EXPERT_base::queryHafterZX()
{
    h = exp(-0.5*dz.dot(invSigma * dz)) * sqrtDetInvSigma * exp(-0.5*dx.cwiseAbs2().dot(invPsi)) * sqrtDetInvPsi;

    return h;
}